

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O1

float basisu::srgb_to_linear(float s)

{
  float fVar1;
  float fVar2;
  
  if ((0.0 <= s) && (s <= 1.0)) {
    if (0.04045 <= s) {
      fVar1 = powf((s + 0.055) * 0.94786733,2.4);
    }
    else {
      fVar1 = s * 0.07739938;
    }
    fVar2 = 0.0;
    if ((0.0 <= fVar1) && (fVar2 = fVar1, 1.0 < fVar1)) {
      fVar2 = 1.0;
    }
    return fVar2;
  }
  __assert_fail("s >= 0.0f && s <= 1.0f",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                ,0x25d,"float basisu::srgb_to_linear(float)");
}

Assistant:

float srgb_to_linear(float s)
	{
		assert(s >= 0.0f && s <= 1.0f);
		if (s < .04045f)
			return saturate(s * (1.0f/12.92f));
		else
			return saturate(powf((s + .055f) * (1.0f/1.055f), 2.4f));
	}